

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  UnicodeString *pUVar4;
  UMemory *pUVar5;
  UnicodeString *pUVar6;
  long lVar7;
  
  if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      pUVar6 = this->fStandaloneShortMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneShortMonths = pUVar6;
      lVar3 = 0x80;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
    else if (width == NARROW) {
      pUVar6 = this->fStandaloneNarrowMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneNarrowMonths = pUVar6;
      lVar3 = 0x90;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      pUVar6 = this->fStandaloneMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneMonths = pUVar6;
      lVar3 = 0x70;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    if (width == ABBREVIATED) {
      pUVar6 = this->fShortMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fShortMonths = pUVar6;
      lVar3 = 0x50;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
    else if (width == NARROW) {
      pUVar6 = this->fNarrowMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fNarrowMonths = pUVar6;
      lVar3 = 0x60;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
    else {
      if (width != WIDE) {
        return;
      }
      pUVar6 = this->fMonths;
      pUVar4 = monthsArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fMonths = pUVar6;
      lVar3 = 0x40;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,monthsArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          monthsArray = monthsArray + 1;
        } while (1 < iVar2);
      }
    }
  }
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lVar3) = count;
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fMonths)
                delete[] fMonths;
            fMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fMonths,count);
            fMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fShortMonths)
                delete[] fShortMonths;
            fShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fShortMonths,count);
            fShortMonthsCount = count;
            break;
        case NARROW :
            if (fNarrowMonths)
                delete[] fNarrowMonths;
            fNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fNarrowMonths,count);
            fNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneMonths)
                delete[] fStandaloneMonths;
            fStandaloneMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneMonths,count);
            fStandaloneMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortMonths)
                delete[] fStandaloneShortMonths;
            fStandaloneShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneShortMonths,count);
            fStandaloneShortMonthsCount = count;
            break;
        case NARROW :
           if (fStandaloneNarrowMonths)
                delete[] fStandaloneNarrowMonths;
            fStandaloneNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneNarrowMonths,count);
            fStandaloneNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}